

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O1

void __thiscall FConsoleBuffer::FormatText(FConsoleBuffer *this,FFont *formatfont,int displaywidth)

{
  uint *puVar1;
  TArray<FBrokenLines_*,_FBrokenLines_*> *this_00;
  TArray<unsigned_int,_unsigned_int> *this_01;
  FBrokenLines *pFVar2;
  uint uVar3;
  int iVar4;
  FBrokenLines *pFVar5;
  ulong uVar6;
  
  if (((this->mLastFont != formatfont) || (this->mLastDisplayWidth != displaywidth)) ||
     (this->mBufferWasCleared == true)) {
    FreeBrokenText(this,0,0x7fffffff);
    if ((this->mBrokenConsoleText).Count != 0) {
      (this->mBrokenConsoleText).Count = 0;
    }
    if ((this->mBrokenStart).Count != 0) {
      (this->mBrokenStart).Count = 0;
    }
    TArray<unsigned_int,_unsigned_int>::Grow(&this->mBrokenStart,1);
    (this->mBrokenStart).Array[(this->mBrokenStart).Count] = 0;
    puVar1 = &(this->mBrokenStart).Count;
    *puVar1 = *puVar1 + 1;
    if ((this->mBrokenLines).Count != 0) {
      (this->mBrokenLines).Count = 0;
    }
    this->mLastFont = formatfont;
    this->mLastDisplayWidth = displaywidth;
    this->mBufferWasCleared = false;
  }
  this_00 = &this->mBrokenConsoleText;
  uVar3 = (this->mBrokenConsoleText).Count;
  uVar6 = (ulong)uVar3;
  if ((uVar3 == (this->mConsoleText).Count) && (this->mLastLineNeedsUpdate == true)) {
    uVar6 = (ulong)(uVar3 - 1);
    V_FreeBrokenLines(this_00->Array[uVar6]);
    TArray<FBrokenLines_*,_FBrokenLines_*>::Resize(this_00,uVar3 - 1);
  }
  this_01 = &this->mBrokenStart;
  TArray<FBrokenLines_*,_FBrokenLines_*>::Resize
            (&this->mBrokenLines,(this->mBrokenStart).Array[uVar6]);
  TArray<unsigned_int,_unsigned_int>::Resize(this_01,(uint)uVar6);
  if ((uint)uVar6 < (this->mConsoleText).Count) {
    do {
      pFVar5 = V_BreakLines(formatfont,displaywidth,(BYTE *)(this->mConsoleText).Array[uVar6].Chars,
                            true);
      TArray<FBrokenLines_*,_FBrokenLines_*>::Grow(this_00,1);
      uVar3 = (this->mBrokenConsoleText).Count;
      (this->mBrokenConsoleText).Array[uVar3] = pFVar5;
      (this->mBrokenConsoleText).Count = uVar3 + 1;
      uVar3 = (this->mBrokenLines).Count;
      TArray<unsigned_int,_unsigned_int>::Grow(this_01,1);
      (this->mBrokenStart).Array[(this->mBrokenStart).Count] = uVar3;
      puVar1 = &(this->mBrokenStart).Count;
      *puVar1 = *puVar1 + 1;
      iVar4 = pFVar5->Width;
      while (iVar4 != -1) {
        TArray<FBrokenLines_*,_FBrokenLines_*>::Grow(&this->mBrokenLines,1);
        uVar3 = (this->mBrokenLines).Count;
        (this->mBrokenLines).Array[uVar3] = pFVar5;
        (this->mBrokenLines).Count = uVar3 + 1;
        pFVar2 = pFVar5 + 1;
        pFVar5 = pFVar5 + 1;
        iVar4 = pFVar2->Width;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->mConsoleText).Count);
  }
  uVar3 = (this->mBrokenLines).Count;
  this->mTextLines = uVar3;
  TArray<unsigned_int,_unsigned_int>::Grow(this_01,1);
  (this->mBrokenStart).Array[(this->mBrokenStart).Count] = uVar3;
  puVar1 = &(this->mBrokenStart).Count;
  *puVar1 = *puVar1 + 1;
  this->mLastLineNeedsUpdate = false;
  return;
}

Assistant:

void FConsoleBuffer::FormatText(FFont *formatfont, int displaywidth)
{
	if (formatfont != mLastFont || displaywidth != mLastDisplayWidth || mBufferWasCleared)
	{
		FreeBrokenText();
		mBrokenConsoleText.Clear();
		mBrokenStart.Clear();
		mBrokenStart.Push(0);
		mBrokenLines.Clear();
		mLastFont = formatfont;
		mLastDisplayWidth = displaywidth;
		mBufferWasCleared = false;
	}
	unsigned brokensize = mBrokenConsoleText.Size();
	if (brokensize == mConsoleText.Size())
	{
		// The last line got text appended. We have to wait until here to format it because
		// it is possible that during display new text will be added from the NetUpdate calls in the software version of DrawTextureV.
		if (mLastLineNeedsUpdate)
		{
			brokensize--;
			V_FreeBrokenLines(mBrokenConsoleText[brokensize]);
			mBrokenConsoleText.Resize(brokensize);
		}
	}
	mBrokenLines.Resize(mBrokenStart[brokensize]);
	mBrokenStart.Resize(brokensize);
	for (unsigned i = brokensize; i < mConsoleText.Size(); i++)
	{
		FBrokenLines *bl = V_BreakLines(formatfont, displaywidth, mConsoleText[i], true);
		mBrokenConsoleText.Push(bl);
		mBrokenStart.Push(mBrokenLines.Size());
		while (bl->Width != -1)
		{
			mBrokenLines.Push(bl);
			bl++;
		}
	}
	mTextLines = mBrokenLines.Size();
	mBrokenStart.Push(mTextLines);
	mLastLineNeedsUpdate = false;
}